

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

int Lf_SetAddCut(Lf_Cut_t **pCuts,int nCuts,int nCutNum)

{
  Lf_Cut_t *pLVar1;
  Lf_Cut_t *pLVar2;
  bool bVar3;
  int i;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  
  if (nCuts == 0) {
    return 1;
  }
  uVar6 = (ulong)(uint)nCuts;
  bVar3 = false;
  for (lVar10 = 1; lVar10 < nCuts; lVar10 = lVar10 + 1) {
    pLVar1 = pCuts[nCuts];
    pLVar2 = pCuts[lVar10];
    if ((((byte)pLVar1->field_0x17 < (byte)pLVar2->field_0x17) &&
        ((pLVar1->Sign & ~pLVar2->Sign) == 0)) &&
       (iVar4 = Lf_SetCutIsContainedOrder(pLVar2,pLVar1), iVar4 != 0)) {
      *(uint *)&pCuts[lVar10]->field_0x14 = *(uint *)&pCuts[lVar10]->field_0x14 | 0xff000000;
      bVar3 = true;
    }
  }
  if (bVar3) {
    uVar6 = 0;
    if (0 < nCuts) {
      uVar6 = (ulong)(uint)nCuts;
    }
    iVar4 = 1;
    for (lVar10 = 1; lVar10 - uVar6 != 1; lVar10 = lVar10 + 1) {
      if (*(uint *)&pCuts[lVar10]->field_0x14 < 0xff000000) {
        lVar7 = (long)iVar4;
        if (lVar7 < lVar10) {
          pLVar1 = pCuts[lVar7];
          pCuts[lVar7] = pCuts[lVar10];
          pCuts[lVar10] = pLVar1;
        }
        iVar4 = iVar4 + 1;
      }
    }
    uVar6 = (ulong)(iVar4 - 1);
  }
  iVar4 = (int)uVar6;
  if (iVar4 < 1) {
    __assert_fail("nCuts >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,899,"int Lf_SetAddCut(Lf_Cut_t **, int, int)");
  }
  pLVar1 = *pCuts;
  pLVar2 = pCuts[uVar6];
  if (pLVar2->Delay <= pLVar1->Delay) {
    if (pLVar1->Delay <= pLVar2->Delay) {
      uVar8 = *(uint *)&pLVar1->field_0x14 >> 0x18;
      uVar9 = *(uint *)&pLVar2->field_0x14 >> 0x18;
      if ((uVar8 < uVar9) ||
         ((uVar8 <= uVar9 && (pLVar1->Flow < pLVar2->Flow || pLVar1->Flow == pLVar2->Flow))))
      goto LAB_00592dbf;
    }
    *pCuts = pLVar2;
    pCuts[uVar6] = pLVar1;
    if (((byte)pLVar2->field_0x17 < (byte)pLVar1->field_0x17) &&
       (((pLVar2->Sign & ~pLVar1->Sign) == 0 &&
        (iVar5 = Lf_SetCutIsContainedOrder(pLVar1,pLVar2), iVar5 != 0)))) {
      return iVar4;
    }
  }
LAB_00592dbf:
  for (; 1 < (int)uVar6; uVar6 = (ulong)((int)uVar6 - 1)) {
    pLVar1 = pCuts[uVar6 - 1];
    pLVar2 = pCuts[uVar6];
    uVar8 = *(uint *)&pLVar1->field_0x14 >> 0x16 & 1;
    uVar9 = *(uint *)&pLVar2->field_0x14 >> 0x16 & 1;
    if (uVar8 < uVar9) break;
    if (uVar8 <= uVar9) {
      if (pLVar1->Flow < pLVar2->Flow) break;
      if (pLVar1->Flow <= pLVar2->Flow) {
        if ((pLVar1->Delay < pLVar2->Delay) ||
           ((pLVar1->Delay <= pLVar2->Delay &&
            (*(uint *)&pLVar1->field_0x14 >> 0x18 < *(uint *)&pLVar2->field_0x14 >> 0x18)))) break;
      }
    }
    pCuts[uVar6 - 1] = pLVar2;
    pCuts[uVar6] = pLVar1;
  }
  iVar5 = nCutNum + -1;
  if (iVar4 + 1 < nCutNum + -1) {
    iVar5 = iVar4 + 1;
  }
  return iVar5;
}

Assistant:

static inline int Lf_SetAddCut( Lf_Cut_t ** pCuts, int nCuts, int nCutNum )
{
    if ( nCuts == 0 )
        return 1;
    nCuts = Lf_SetLastCutContainsArea(pCuts, nCuts);
    assert( nCuts >= 1 );
    if ( Lf_CutCompareDelay(pCuts[0], pCuts[nCuts]) == 1 ) // new cut is better for delay
    {
        ABC_SWAP( Lf_Cut_t *, pCuts[0], pCuts[nCuts] );
        // if old cut (now cut number nCuts) is contained - remove it
        if ( pCuts[0]->nLeaves < pCuts[nCuts]->nLeaves && (pCuts[0]->Sign & pCuts[nCuts]->Sign) == pCuts[0]->Sign && Lf_SetCutIsContainedOrder(pCuts[nCuts], pCuts[0]) )
            return nCuts;
    }
    // sort area cuts by area
    Lf_SetSortByArea( pCuts, nCuts );
    // add new cut if there is room
    return Abc_MinInt( nCuts + 1, nCutNum - 1 );
}